

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall
QtPrivate::BindingStatusOrList::setStatusAndClearList
          (BindingStatusOrList *this,QBindingStatus *status)

{
  ulong uVar1;
  pointer ppQVar2;
  pointer ppQVar3;
  _Vector_base<QObject_*,_std::allocator<QObject_*>_> *this_00;
  
  uVar1 = (this->data).super___atomic_base<unsigned_long_long>._M_i;
  this_00 = (_Vector_base<QObject_*,_std::allocator<QObject_*>_> *)(uVar1 & 0xfffffffffffffffe);
  if (this_00 != (_Vector_base<QObject_*,_std::allocator<QObject_*>_> *)0x0 && (uVar1 & 1) != 0) {
    ppQVar2 = (this_00->_M_impl).super__Vector_impl_data._M_finish;
    for (ppQVar3 = (this_00->_M_impl).super__Vector_impl_data._M_start; ppQVar3 != ppQVar2;
        ppQVar3 = ppQVar3 + 1) {
      QObjectPrivate::reinitBindingStorageAfterThreadMove((QObjectPrivate *)((*ppQVar3)->d_ptr).d);
    }
    std::_Vector_base<QObject_*,_std::allocator<QObject_*>_>::~_Vector_base(this_00);
    operator_delete(this_00,0x18);
  }
  (this->data).super___atomic_base<unsigned_long_long>._M_i = (__int_type)status;
  return;
}

Assistant:

void QtPrivate::BindingStatusOrList::setStatusAndClearList(QBindingStatus *status) noexcept
{

    if (auto pendingObjects = list()) {
        for (auto obj: *pendingObjects)
            QObjectPrivate::get(obj)->reinitBindingStorageAfterThreadMove();
        delete pendingObjects;
    }
    // synchronizes-with the load-acquire in bindingStatus():
    data.store(encodeBindingStatus(status), std::memory_order_release);
}